

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall
QItemSelectionModelPrivate::layoutAboutToBeChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_1,
          LayoutChangeHint hint)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  pair<QPersistentModelIndex,_unsigned_int> **this_01;
  QItemSelectionRange *other;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  pair<QPersistentModelIndex,_unsigned_int> *ppVar3;
  qsizetype qVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> local_68;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPersistentModelIndex>::clear(&this->savedPersistentIndexes);
  QList<QPersistentModelIndex>::clear(&this->savedPersistentCurrentIndexes);
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(&this->savedPersistentRowLengths);
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
            (&this->savedPersistentCurrentRowLengths);
  if (((this->ranges).super_QList<QItemSelectionRange>.d.size == 0) &&
     ((this->currentSelection).super_QList<QItemSelectionRange>.d.size == 1)) {
    this_01 = &local_68.ptr;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)&DAT_aaaaaaaaaaaaaaaa;
    other = (this->currentSelection).super_QList<QItemSelectionRange>.d.ptr;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_68,&other->tl);
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)this_01,&other->br);
    local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::parent(&local_48,(QPersistentModelIndex *)&local_68);
    this_00 = &this->model;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    iVar5 = (*(pQVar1->super_QObject)._vptr_QObject[0xf])(pQVar1,&local_48);
    this->tableRowCount = iVar5;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    iVar5 = (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,&local_48);
    this->tableColCount = iVar5;
    if (1000 < iVar5 * this->tableRowCount) {
      iVar5 = QPersistentModelIndex::row((QPersistentModelIndex *)&local_68);
      if (iVar5 == 0) {
        iVar5 = QPersistentModelIndex::column((QPersistentModelIndex *)&local_68);
        if (iVar5 == 0) {
          iVar5 = QPersistentModelIndex::row((QPersistentModelIndex *)this_01);
          if (iVar5 == this->tableRowCount + -1) {
            iVar5 = QPersistentModelIndex::column((QPersistentModelIndex *)this_01);
            if (iVar5 == this->tableColCount + -1) {
              this->tableSelected = true;
              QPersistentModelIndex::operator=(&this->tableParent,&local_48);
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_01);
              QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
              goto LAB_0046b3db;
            }
          }
        }
      }
    }
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)this_01);
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
  }
  this->tableSelected = false;
  if (hint == VerticalSortHint) {
    qSelectionPersistentRowLengths
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68,&this->ranges);
    qVar4 = local_68.size;
    ppVar3 = local_68.ptr;
    pDVar2 = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
    local_68.size = 0;
    local_48._0_8_ = (this->savedPersistentRowLengths).d.d;
    local_48.i = (quintptr)(this->savedPersistentRowLengths).d.ptr;
    (this->savedPersistentRowLengths).d.d = pDVar2;
    (this->savedPersistentRowLengths).d.ptr = ppVar3;
    local_48.m.ptr = (QAbstractItemModel *)(this->savedPersistentRowLengths).d.size;
    (this->savedPersistentRowLengths).d.size = qVar4;
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_48);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              (&local_68);
    qSelectionPersistentRowLengths
              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_68,
               &this->currentSelection);
    qVar4 = local_68.size;
    ppVar3 = local_68.ptr;
    pDVar2 = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
    local_68.size = 0;
    local_48._0_8_ = (this->savedPersistentCurrentRowLengths).d.d;
    local_48.i = (quintptr)(this->savedPersistentCurrentRowLengths).d.ptr;
    (this->savedPersistentCurrentRowLengths).d.d = pDVar2;
    (this->savedPersistentCurrentRowLengths).d.ptr = ppVar3;
    local_48.m.ptr = (QAbstractItemModel *)(this->savedPersistentCurrentRowLengths).d.size;
    (this->savedPersistentCurrentRowLengths).d.size = qVar4;
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              ((QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *)&local_48);
    QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::~QArrayDataPointer
              (&local_68);
  }
  else {
    qSelectionIndexes<QList<QPersistentModelIndex>>
              ((QList<QPersistentModelIndex> *)&local_68,&this->ranges);
    qVar4 = local_68.size;
    ppVar3 = local_68.ptr;
    pDVar2 = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
    local_68.size = 0;
    local_48._0_8_ = (this->savedPersistentIndexes).d.d;
    local_48.i = (quintptr)(this->savedPersistentIndexes).d.ptr;
    (this->savedPersistentIndexes).d.d = (Data *)pDVar2;
    (this->savedPersistentIndexes).d.ptr = &ppVar3->first;
    local_48.m.ptr = (QAbstractItemModel *)(this->savedPersistentIndexes).d.size;
    (this->savedPersistentIndexes).d.size = qVar4;
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_48);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_68);
    qSelectionIndexes<QList<QPersistentModelIndex>>
              ((QList<QPersistentModelIndex> *)&local_68,&this->currentSelection);
    qVar4 = local_68.size;
    ppVar3 = local_68.ptr;
    pDVar2 = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
    local_68.size = 0;
    local_48._0_8_ = (this->savedPersistentCurrentIndexes).d.d;
    local_48.i = (quintptr)(this->savedPersistentCurrentIndexes).d.ptr;
    (this->savedPersistentCurrentIndexes).d.d = (Data *)pDVar2;
    (this->savedPersistentCurrentIndexes).d.ptr = &ppVar3->first;
    local_48.m.ptr = (QAbstractItemModel *)(this->savedPersistentCurrentIndexes).d.size;
    (this->savedPersistentCurrentIndexes).d.size = qVar4;
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_48);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
              ((QArrayDataPointer<QPersistentModelIndex> *)&local_68);
  }
LAB_0046b3db:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::layoutAboutToBeChanged(const QList<QPersistentModelIndex> &,
                                                        QAbstractItemModel::LayoutChangeHint hint)
{
    savedPersistentIndexes.clear();
    savedPersistentCurrentIndexes.clear();
    savedPersistentRowLengths.clear();
    savedPersistentCurrentRowLengths.clear();

    // optimization for when all indexes are selected
    // (only if there is lots of items (1000) because this is not entirely correct)
    if (ranges.isEmpty() && currentSelection.size() == 1) {
        QItemSelectionRange range = currentSelection.constFirst();
        QModelIndex parent = range.parent();
        tableRowCount = model->rowCount(parent);
        tableColCount = model->columnCount(parent);
        if (tableRowCount * tableColCount > 1000
            && range.top() == 0
            && range.left() == 0
            && range.bottom() == tableRowCount - 1
            && range.right() == tableColCount - 1) {
            tableSelected = true;
            tableParent = parent;
            return;
        }
    }
    tableSelected = false;

    if (hint == QAbstractItemModel::VerticalSortHint) {
        // Special case when we know we're sorting vertically. We can assume that all indexes for columns
        // are displaced the same way, and therefore we only need to track an index from one column per
        // row with a QPersistentModelIndex together with the length of items to the right of it
        // which are displaced the same way.
        // An algorithm which contains the same assumption is used to process layoutChanged.
        savedPersistentRowLengths = qSelectionPersistentRowLengths(ranges);
        savedPersistentCurrentRowLengths = qSelectionPersistentRowLengths(currentSelection);
    } else {
        savedPersistentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(ranges);
        savedPersistentCurrentIndexes = qSelectionIndexes<QList<QPersistentModelIndex>>(currentSelection);
    }
}